

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t zesGetLedProcAddrTable(ze_api_version_t version,zes_led_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnLedGetProperties_t p_Var3;
  zes_pfnLedGetState_t p_Var4;
  zes_pfnLedSetColor_t p_Var5;
  bool bVar6;
  int iVar7;
  ze_result_t zVar8;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar9;
  
  puVar9 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 == puVar9) {
LAB_001bf1a1:
    zVar8 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zes_led_dditable_t *)0x0) {
    zVar8 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar8 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= *(int *)(loader::context + 0x15c0)) {
      bVar6 = false;
      do {
        while ((*(int *)(puVar9 + 1) != 0 ||
               (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar9,"zesGetLedProcAddrTable"),
               UNRECOVERED_JUMPTABLE == (code *)0x0))) {
LAB_001bf113:
          puVar9 = puVar9 + 0x1b3;
          if (puVar9 == puVar1) {
            if (!bVar6) goto LAB_001bf1a1;
            goto LAB_001bf13f;
          }
        }
        iVar7 = (*UNRECOVERED_JUMPTABLE)(version,puVar9 + 0x192);
        if (iVar7 != 0) {
          *(int *)(puVar9 + 1) = iVar7;
          goto LAB_001bf113;
        }
        puVar9 = puVar9 + 0x1b3;
        bVar6 = true;
      } while (puVar9 != puVar1);
LAB_001bf13f:
      lVar2 = **(long **)(loader::context + 0x1610);
      if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) <
           2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        p_Var3 = *(zes_pfnLedGetProperties_t *)(lVar2 + 0xc90);
        p_Var4 = *(zes_pfnLedGetState_t *)(lVar2 + 0xc98);
        p_Var5 = *(zes_pfnLedSetColor_t *)(lVar2 + 0xca8);
        pDdiTable->pfnSetState = *(zes_pfnLedSetState_t *)(lVar2 + 0xca0);
        pDdiTable->pfnSetColor = p_Var5;
        pDdiTable->pfnGetProperties = p_Var3;
        pDdiTable->pfnGetState = p_Var4;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesLedGetProperties;
        pDdiTable->pfnGetState = loader::zesLedGetState;
        pDdiTable->pfnSetState = loader::zesLedSetState;
        pDdiTable->pfnSetColor = loader::zesLedSetColor;
      }
      if (*(long *)(loader::context + 0x1618) == 0) {
        zVar8 = ZE_RESULT_SUCCESS;
      }
      else {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetLedProcAddrTable");
        zVar8 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
          zVar8 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
          return zVar8;
        }
      }
    }
  }
  return zVar8;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetLedProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_led_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetLedProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Led);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesLedGetProperties;
            pDdiTable->pfnGetState                                 = loader::zesLedGetState;
            pDdiTable->pfnSetState                                 = loader::zesLedSetState;
            pDdiTable->pfnSetColor                                 = loader::zesLedSetColor;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Led;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetLedProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}